

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

int stb_ps_count(stb_ps *ps)

{
  stb_ps_hash *h;
  stb_ps_array *a;
  stb_ps_bucket *b;
  stb_ps *ps_local;
  
  b._0_4_ = (uint)ps;
  switch((uint)b & 3) {
  case 0:
    ps_local._4_4_ = (uint)(ps != (stb_ps *)0x0);
    break;
  case 1:
    ps_local._4_4_ =
         (uint)(*(long *)(ps + -1) != 0) + (uint)(*(long *)(ps + 7) != 0) +
         (uint)(*(long *)(ps + 0xf) != 0) + (uint)(*(long *)(ps + 0x17) != 0);
    break;
  case 2:
    ps_local._4_4_ = *(uint *)(ps + -2);
    break;
  case 3:
    ps_local._4_4_ = *(uint *)(ps + 5);
    break;
  default:
    ps_local._4_4_ = 0;
  }
  return ps_local._4_4_;
}

Assistant:

int stb_ps_count (stb_ps *ps)
{
   switch (3 & (int) ps) {
      case STB_ps_direct:
         return ps != NULL;
      case STB_ps_bucket: {
         stb_ps_bucket *b = GetBucket(ps);
         return (b->p[0] != NULL) + (b->p[1] != NULL) +
                (b->p[2] != NULL) + (b->p[3] != NULL);
      }
      case STB_ps_array: {
         stb_ps_array *a = GetArray(ps);
         return a->count;
      }
      case STB_ps_hash: {
         stb_ps_hash *h = GetHash(ps);
         return h->count;
      }
   }
   return 0;
}